

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwJoystickPresent(int jid)

{
  GLFWbool GVar1;
  int iVar2;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/glfw/src/input.c"
                  ,0x3b9,"int glfwJoystickPresent(int)");
  }
  if (jid < 0x10) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      if ((_glfw.joysticksInitialized == 0) &&
         (GVar1 = (*_glfw.platform.initJoysticks)(), GVar1 == 0)) {
        (*_glfw.platform.terminateJoysticks)();
        return 0;
      }
      _glfw.joysticksInitialized = 1;
      if (_glfw.joysticks[(uint)jid].present != 0) {
        iVar2 = (*_glfw.platform.pollJoystick)(_glfw.joysticks + (uint)jid,0);
        return iVar2;
      }
    }
    return 0;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/glfw/src/input.c"
                ,0x3ba,"int glfwJoystickPresent(int)");
}

Assistant:

GLFWAPI int glfwJoystickPresent(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    if (!initJoysticks())
        return GLFW_FALSE;

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    return _glfw.platform.pollJoystick(js, _GLFW_POLL_PRESENCE);
}